

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O0

int compare(string *directory1,string *basename1,string *directory2,string *basename2,
           Bounds *iBounds,Bounds *jBounds,Bounds *kBounds,Bounds *lBounds,double tolerance,
           bool infoOnly,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *specificFields)

{
  pointer *this;
  bool bVar1;
  vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *__x;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  string *psVar5;
  ostream *poVar6;
  MetainfoSet *this_00;
  unsigned_long *puVar7;
  reference fieldname;
  DataFieldInfo *pDVar8;
  undefined1 local_4e0 [8];
  vector<bool,_std::allocator<bool>_> failed;
  undefined1 local_4b0 [7];
  bool equal;
  IJKLBounds bounds;
  DataFieldInfo info2;
  DataFieldInfo info1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *field;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_310;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_300;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  size_type local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  undefined1 local_2c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fieldsAtSavepoint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  int local_250;
  byte local_249;
  int i;
  bool hasDifferences;
  vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> savepoints;
  Serializer serializer2;
  undefined1 local_138 [8];
  Serializer serializer1;
  bool infoOnly_local;
  double tolerance_local;
  Bounds *jBounds_local;
  Bounds *iBounds_local;
  string *basename2_local;
  string *directory2_local;
  string *basename1_local;
  string *directory1_local;
  
  serializer1._231_1_ = infoOnly;
  ser::Serializer::Serializer((Serializer *)local_138);
  ser::Serializer::Init((Serializer *)local_138,directory1,basename1,SerializerOpenModeRead);
  ser::Serializer::Serializer
            ((Serializer *)
             &savepoints.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  ser::Serializer::Init
            ((Serializer *)
             &savepoints.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,directory2,basename2,SerializerOpenModeRead
            );
  __x = ser::Serializer::savepoints((Serializer *)local_138);
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::vector
            ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,__x);
  local_249 = 0;
  for (local_250 = 0; uVar2 = (ulong)local_250,
      sVar3 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::size
                        ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i),
      uVar2 < sVar3; local_250 = local_250 + 1) {
    pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                       ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                        (long)local_250);
    psVar5 = ser::Savepoint::name_abi_cxx11_(pvVar4);
    pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                       ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                        (long)local_250);
    ser::Savepoint::name_abi_cxx11_(pvVar4);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_270,(ulong)psVar5);
    bVar1 = std::operator!=(&local_270,"-out");
    std::__cxx11::string::~string((string *)&local_270);
    if (!bVar1) {
      poVar6 = std::operator<<((ostream *)&std::cout,"---------------------------------");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                         ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                          (long)local_250);
      psVar5 = ser::Savepoint::name_abi_cxx11_(pvVar4);
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)psVar5);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                         ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                          (long)local_250);
      this_00 = ser::Savepoint::metainfo(pvVar4);
      ser::MetainfoSet::ToString_abi_cxx11_
                ((string *)
                 &fieldsAtSavepoint.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
      poVar6 = std::operator<<((ostream *)&std::cout,
                               (string *)
                               &fieldsAtSavepoint.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string
                ((string *)
                 &fieldsAtSavepoint.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                         ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                          (long)local_250);
      ser::Serializer::FieldsAtSavepoint_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&fields.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(Serializer *)local_138,
                 pvVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2c0);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(specificFields);
      if (bVar1) {
        pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                           ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                            (long)local_250);
        ser::Serializer::FieldsAtSavepoint_abi_cxx11_(&local_2d8,(Serializer *)local_138,pvVar4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2c0,&local_2d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2d8);
      }
      else {
        local_2e0 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(specificFields);
        it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fields.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        puVar7 = std::min<unsigned_long>(&local_2e0,(unsigned_long *)&it);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2c0,*puVar7);
        this = &fields.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_2f8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
        local_300._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
        local_308._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(specificFields);
        local_310._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(specificFields);
        local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2c0);
        local_2f0 = std::
                    set_intersection<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (local_2f8,local_300,local_308,local_310,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_318);
        __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_2c0);
        sVar3 = __gnu_cxx::operator-
                          (&local_2f0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&__range2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2c0,sVar3);
      }
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2c0);
      field = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2c0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&field), bVar1) {
        fieldname = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
        poVar6 = std::operator<<((ostream *)&std::cout,'\t');
        poVar6 = std::operator<<(poVar6,(string *)fieldname);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pDVar8 = ser::Serializer::FindField((Serializer *)local_138,fieldname);
        ser::DataFieldInfo::DataFieldInfo
                  ((DataFieldInfo *)
                   &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count,pDVar8);
        pDVar8 = ser::Serializer::FindField
                           ((Serializer *)
                            &savepoints.
                             super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,fieldname);
        ser::DataFieldInfo::DataFieldInfo((DataFieldInfo *)&bounds.lLower,pDVar8);
        getIJKLBounds((IJKLBounds *)local_4b0,
                      (DataFieldInfo *)
                      &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      iBounds,jBounds,kBounds,lBounds);
        failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._7_1_ =
             compareInfo((DataFieldInfo *)
                         &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (DataFieldInfo *)&bounds.lLower);
        if ((bool)failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                  ._M_end_of_storage._7_1_) {
          if ((serializer1._231_1_ & 1) == 0) {
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)local_4e0);
            psVar5 = ser::DataFieldInfo::type_abi_cxx11_
                               ((DataFieldInfo *)
                                &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
            bVar1 = std::operator==(psVar5,"integer");
            if (bVar1) {
LAB_001372e7:
              pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                                 ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                                  (long)local_250);
              failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage._7_1_ =
                   compareData<int>((Serializer *)local_138,
                                    (Serializer *)
                                    &savepoints.
                                     super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4,
                                    (DataFieldInfo *)
                                    &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,(DataFieldInfo *)&bounds.lLower,
                                    (IJKLBounds *)local_4b0,tolerance,
                                    (vector<bool,_std::allocator<bool>_> *)local_4e0);
              if (!(bool)failed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage._7_1_) {
                pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                                   ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                                    (long)local_250);
                printDifference<int>
                          ((Serializer *)local_138,
                           (Serializer *)
                           &savepoints.
                            super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4,
                           (DataFieldInfo *)
                           &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (DataFieldInfo *)&bounds.lLower,(IJKLBounds *)local_4b0,
                           (vector<bool,_std::allocator<bool>_> *)local_4e0);
              }
LAB_00137647:
              local_249 = (local_249 & 1) != 0 ||
                          ((failed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage._7_1_ ^ 0xff) & 1) != 0;
              failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage._0_4_ = 0;
            }
            else {
              psVar5 = ser::DataFieldInfo::type_abi_cxx11_
                                 ((DataFieldInfo *)
                                  &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
              bVar1 = std::operator==(psVar5,"int");
              if (bVar1) goto LAB_001372e7;
              psVar5 = ser::DataFieldInfo::type_abi_cxx11_
                                 ((DataFieldInfo *)
                                  &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
              bVar1 = std::operator==(psVar5,"double");
              if (bVar1) {
                pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                                   ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                                    (long)local_250);
                failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage._7_1_ =
                     compareData<double>((Serializer *)local_138,
                                         (Serializer *)
                                         &savepoints.
                                          super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4,
                                         (DataFieldInfo *)
                                         &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(DataFieldInfo *)&bounds.lLower,
                                         (IJKLBounds *)local_4b0,tolerance,
                                         (vector<bool,_std::allocator<bool>_> *)local_4e0);
                if (!(bool)failed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage._7_1_) {
                  pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                                     ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                                      (long)local_250);
                  printDifference<double>
                            ((Serializer *)local_138,
                             (Serializer *)
                             &savepoints.
                              super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4,
                             (DataFieldInfo *)
                             &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count
                             ,(DataFieldInfo *)&bounds.lLower,(IJKLBounds *)local_4b0,
                             (vector<bool,_std::allocator<bool>_> *)local_4e0);
                }
                goto LAB_00137647;
              }
              psVar5 = ser::DataFieldInfo::type_abi_cxx11_
                                 ((DataFieldInfo *)
                                  &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
              bVar1 = std::operator==(psVar5,"float");
              if (bVar1) {
                pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                                   ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                                    (long)local_250);
                failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_end_of_storage._7_1_ =
                     compareData<float>((Serializer *)local_138,
                                        (Serializer *)
                                        &savepoints.
                                         super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4,
                                        (DataFieldInfo *)
                                        &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count,(DataFieldInfo *)&bounds.lLower,
                                        (IJKLBounds *)local_4b0,tolerance,
                                        (vector<bool,_std::allocator<bool>_> *)local_4e0);
                if (!(bool)failed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage._7_1_) {
                  pvVar4 = std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::operator[]
                                     ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i,
                                      (long)local_250);
                  printDifference<float>
                            ((Serializer *)local_138,
                             (Serializer *)
                             &savepoints.
                              super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4,
                             (DataFieldInfo *)
                             &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count
                             ,(DataFieldInfo *)&bounds.lLower,(IJKLBounds *)local_4b0,
                             (vector<bool,_std::allocator<bool>_> *)local_4e0);
                }
                goto LAB_00137647;
              }
              poVar6 = std::operator<<((ostream *)&std::cerr,"Unsupported type: ");
              psVar5 = ser::DataFieldInfo::type_abi_cxx11_
                                 ((DataFieldInfo *)
                                  &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header.
                                   _M_node_count);
              poVar6 = std::operator<<(poVar6,(string *)psVar5);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              directory1_local._4_4_ = 2;
              failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage._0_4_ = 1;
            }
            std::vector<bool,_std::allocator<bool>_>::~vector
                      ((vector<bool,_std::allocator<bool>_> *)local_4e0);
          }
          else {
            failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage._0_4_ = 6;
          }
        }
        else {
          directory1_local._4_4_ = 1;
          failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage._0_4_ = 1;
        }
        ser::DataFieldInfo::~DataFieldInfo((DataFieldInfo *)&bounds.lLower);
        ser::DataFieldInfo::~DataFieldInfo
                  ((DataFieldInfo *)
                   &info2.metainfo_.data_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (((int)failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                  ._M_end_of_storage != 0) &&
           ((int)failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_end_of_storage != 6)) goto LAB_001376f5;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._0_4_ = 0;
LAB_001376f5:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&fields.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((int)failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage != 0) goto LAB_00137776;
    }
  }
  if ((local_249 & 1) == 0) {
    directory1_local._4_4_ = 0;
    failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  else {
    directory1_local._4_4_ = 1;
    failed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
LAB_00137776:
  std::vector<ser::Savepoint,_std::allocator<ser::Savepoint>_>::~vector
            ((vector<ser::Savepoint,_std::allocator<ser::Savepoint>_> *)&i);
  ser::Serializer::~Serializer
            ((Serializer *)
             &savepoints.super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  ser::Serializer::~Serializer((Serializer *)local_138);
  return directory1_local._4_4_;
}

Assistant:

int compare(const std::string& directory1, const std::string& basename1,
            const std::string& directory2, const std::string& basename2,
            const Bounds& iBounds, const Bounds& jBounds,
            const Bounds& kBounds, const Bounds& lBounds,
            double tolerance, bool infoOnly, const vector<string>& specificFields)

{
    Serializer serializer1;
    serializer1.Init(directory1, basename1, SerializerOpenModeRead);

    Serializer serializer2;
    serializer2.Init(directory2, basename2, SerializerOpenModeRead);

    vector<Savepoint> savepoints = serializer1.savepoints();

    bool hasDifferences = false;

    for (int i = 0; i < savepoints.size(); i++)
    {
        if (savepoints[i].name().substr(savepoints[i].name().size() - 4, 4) != "-out")
            continue;

        std::cout << "---------------------------------" << std::endl;
        std::cout << savepoints[i].name()                << std::endl;
        std::cout << savepoints[i].metainfo().ToString() << std::endl;

        vector<string> fieldsAtSavepoint = serializer1.FieldsAtSavepoint(savepoints[i]);
        vector<string> fields;

        if (specificFields.empty()) {

            fields = serializer1.FieldsAtSavepoint(savepoints[i]);
        } else {
            fields.resize(std::min(specificFields.size(), fieldsAtSavepoint.size()));
            auto it = std::set_intersection(fieldsAtSavepoint.begin(), fieldsAtSavepoint.end(),
                specificFields.begin(), specificFields.end(), fields.begin());
            fields.resize(it - fields.begin());
        }

        for (auto const& field : fields) {
            std::cout << '\t' << field << std::endl;

            DataFieldInfo info1 = serializer1.FindField(field);
            DataFieldInfo info2 = serializer2.FindField(field);

            IJKLBounds bounds = getIJKLBounds(info1, iBounds, jBounds, kBounds, lBounds);

            bool equal = compareInfo(info1, info2);
            if (!equal) {
                return 1;
            } else if (infoOnly) {
                continue;
            }

            vector<bool> failed;

            if (info1.type() == "integer" || info1.type() == "int") {
                equal = compareData<int>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<int>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else if (info1.type() == "double") {
                equal = compareData<double>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<double>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else if (info1.type() == "float") {
                equal = compareData<float>(serializer1, serializer2, savepoints[i], info1, info2, bounds, tolerance, failed);
                if (!equal) {
                    printDifference<float>(serializer1, serializer2, savepoints[i], info1, info2, bounds, failed);
                }
            } else {
                std::cerr << "Unsupported type: " << info1.type() << std::endl;
                return 2;
            }
            hasDifferences = hasDifferences | !equal;
        }
    }

    if (hasDifferences) {
        return 1;
    }
    return 0;
}